

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cansniffer.c
# Opt level: O3

int readsettings(char *name)

{
  int iVar1;
  int __fd;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  size_t __nbytes;
  char fname [41];
  char buf [142];
  char local_f8 [48];
  undefined1 local_c8;
  char local_c7 [9];
  byte local_be;
  char local_bc [14];
  char acStack_ae [126];
  
  memset(&local_c8,0,0x8e);
  if (canfd_mode == 1) {
    builtin_strncpy(local_f8 + 8,"_fd.",5);
    __nbytes = 0x8d;
  }
  else {
    if (canfd_mode != 0) {
      puts("readsettings failed due to unspecified CAN FD mode");
      return -1;
    }
    local_f8[8] = '.';
    local_f8[9] = '\0';
    __nbytes = 0x1d;
  }
  builtin_strncpy(local_f8,"sniffset",8);
  sVar2 = strlen(local_f8);
  strncat(local_f8,name,0x28 - sVar2);
  __fd = open(local_f8,0);
  if (__fd < 1) {
    return -1;
  }
  idx = 0;
  do {
    sVar2 = read(__fd,&local_c8,__nbytes);
    if (sVar2 != __nbytes) break;
    uVar3 = strtoul(local_c7,(char **)0x0,0x10);
    lVar5 = (long)idx;
    sniftab[lVar5].current.can_id = (canid_t)uVar3;
    sniftab[lVar5].flags = sniftab[lVar5].flags & 0xfffffffeU | local_be & 1;
    lVar5 = 7;
    if (max_dlen != '\0') {
      lVar5 = 0x3f;
    }
    uVar3 = (ulong)(uint)((int)lVar5 * 2);
    lVar5 = lVar5 + 0x107298;
    do {
      uVar4 = strtoul(local_bc + uVar3,(char **)0x0,0x10);
      iVar1 = idx;
      *(char *)(lVar5 + (long)idx * 0x158) = (char)uVar4;
      local_bc[uVar3] = '\0';
      uVar3 = uVar3 - 2;
      lVar5 = lVar5 + -1;
    } while (uVar3 != 0xfffffffffffffffe);
    idx = iVar1 + 1;
  } while (iVar1 < 0x7ff);
  close(__fd);
  return idx;
}

Assistant:

int readsettings(char* name)
{
	int fd;
	char fname[FNAME_MAX_LEN + 1];
	char buf[142] = {0};
	int entrylen;
	int j;
	bool done = false;

	if (canfd_mode == CANFD_OFF) {
		entrylen = 29;
		strcpy(fname, SETFNAME);
	} else if (canfd_mode == CANFD_ON) {
		entrylen = 141;
		strcpy(fname, SETFDFNAME);
	} else {
		printf("readsettings failed due to unspecified CAN FD mode\n");
		return -1;
	}

	strncat(fname, name, FNAME_MAX_LEN - strlen(fname));
	fd = open(fname, O_RDONLY);

	if (fd <= 0) {
		return -1;
	}
	idx = 0;
	while (!done) {
		if (read(fd, &buf, entrylen) != entrylen) {
			done = true;
			continue;
		}
		unsigned long id = strtoul(&buf[1], NULL, 16);

		sniftab[idx].current.can_id = id;

		if (buf[10] & 1)
			do_set(idx, ENABLE);
		else
			do_clr(idx, ENABLE);

		for (j = max_dlen - 1; j >= 0 ; j--) {
			sniftab[idx].notch.data[j] =
				(__u8) strtoul(&buf[2*j+12], NULL, 16) & 0xFF;
			buf[2*j+12] = 0; /* cut off each time */
		}

		if (++idx >= MAX_SLOTS)
			break;

	}
	close(fd);
	return idx;
}